

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTConstantExpression.cpp
# Opt level: O1

int __thiscall
MathML::AST::ConstantExpression::clone
          (ConstantExpression *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x40);
  *puVar1 = &PTR__ConstantExpression_009e2bc0;
  *(undefined4 *)(puVar1 + 1) = 0;
  puVar1[3] = puVar1 + 5;
  puVar1[4] = 0;
  *(undefined1 *)(puVar1 + 5) = 0;
  puVar1[7] = 0;
  *(Type *)(puVar1 + 1) = this->mType;
  puVar1[2] = this->mValue;
  std::__cxx11::string::_M_assign((string *)(puVar1 + 3));
  return (int)puVar1;
}

Assistant:

INode* ConstantExpression::clone(CloneFlags cloneFlags) const
        {
            ConstantExpression* copy = new ConstantExpression();
            copy->mType = mType;
            copy->mValue = mValue;
            copy->mStringValue = mStringValue;
            return copy;
        }